

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

Symbol * addLabel(char *symName)

{
  uint32_t uVar1;
  Symbol *sym;
  Section *pSVar2;
  
  if (*symName == '.') {
    __assert_fail("symName[0] != \'.\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x1c2,"addLabel");
  }
  sym = sym_FindExactSymbol(symName);
  if (sym == (Symbol *)0x0) {
    sym = createsymbol(symName);
  }
  else {
    if (sym->type != SYM_REF) {
      error("\'%s\' already defined at ",symName);
      dumpFilename(sym);
      putc(10,_stderr);
      return (Symbol *)0x0;
    }
    updateSymbolFilename(sym);
  }
  sym->type = SYM_LABEL;
  uVar1 = sect_GetSymbolOffset();
  (sym->field_8).value = uVar1;
  if ((exportAll == true) && (*symName != '!')) {
    sym->isExported = true;
  }
  pSVar2 = sect_GetSymbolSection();
  sym->section = pSVar2;
  if (pSVar2 == (Section *)0x0) {
    error("Label \"%s\" created outside of a SECTION\n",symName);
  }
  return sym;
}

Assistant:

static struct Symbol *addLabel(char const *symName)
{
	assert(symName[0] != '.'); // The symbol name must have been expanded prior
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym) {
		sym = createsymbol(symName);
	} else if (sym_IsDefined(sym)) {
		error("'%s' already defined at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL;
	} else {
		updateSymbolFilename(sym);
	}
	// If the symbol already exists as a ref, just "take over" it
	sym->type = SYM_LABEL;
	sym->value = sect_GetSymbolOffset();
	// Don't export anonymous labels
	if (exportAll && symName[0] != '!')
		sym->isExported = true;
	sym->section = sect_GetSymbolSection();

	if (sym && !sym->section)
		error("Label \"%s\" created outside of a SECTION\n", symName);
	return sym;
}